

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# h261.c
# Opt level: O0

int h261_block(bitstream *str,int32_t *block,int intra)

{
  int iVar1;
  uint uVar2;
  uint32_t uVar3;
  bool bVar4;
  int local_4c;
  vs_vlc_val *pvStack_48;
  int j;
  vs_vlc_val *tab;
  int32_t coeff;
  uint32_t sign;
  uint32_t eb;
  uint32_t run;
  uint32_t tmp;
  uint32_t val;
  int i;
  int intra_local;
  int32_t *block_local;
  bitstream *str_local;
  
  tmp = 0;
  val = intra;
  _i = (uint32_t *)block;
  block_local = (int32_t *)str;
  if (intra != 0) {
    run = *block;
    if (str->dir == VS_ENCODE) {
      if ((0xfe < run) || (run == 0)) {
        fprintf(_stderr,"Invalid INTRA DC coeff\n");
        return 1;
      }
      if (run == 0x80) {
        run = 0xff;
      }
    }
    iVar1 = vs_u(str,&run,8);
    if (iVar1 != 0) {
      return 1;
    }
    if (*block_local == 1) {
      if ((run == 0) || (run == 0x80)) {
        fprintf(_stderr,"Invalid INTRA DC coeff\n");
        return 1;
      }
      if (run == 0xff) {
        run = 0x80;
      }
      *_i = run;
    }
    tmp = 1;
  }
  while( true ) {
    if (tmp == 0) {
      pvStack_48 = block_0_vlc;
    }
    else {
      pvStack_48 = block_vlc;
    }
    if (*block_local == 0) {
      sign = 0;
      while( true ) {
        bVar4 = false;
        if ((int)tmp < 0x40) {
          bVar4 = _i[(int)tmp] == 0;
        }
        if (!bVar4) break;
        tmp = tmp + 1;
        sign = sign + 1;
      }
      if (tmp == 0x40) {
        eb = 0;
      }
      else {
        tab._0_4_ = _i[(int)tmp];
        uVar2 = (uint)tab;
        if ((int)(uint)tab < 1) {
          uVar2 = -(uint)tab;
        }
        if (0x7f < (int)uVar2) {
          fprintf(_stderr,"Coeff too large\n");
          return 1;
        }
        uVar2 = (uint)tab;
        if ((int)(uint)tab < 1) {
          uVar2 = -(uint)tab;
        }
        eb = uVar2 | sign << 0xc;
        tab._4_4_ = (uint)((int)(uint)tab < 0);
        local_4c = 0;
        while ((pvStack_48[local_4c].blen != 0 && (pvStack_48[local_4c].val != eb))) {
          local_4c = local_4c + 1;
        }
        if (pvStack_48[local_4c].val != eb) {
          eb = 0xfffff;
        }
        coeff = (uint)tab & 0xff;
        tmp = tmp + 1;
      }
    }
    iVar1 = vs_vlc((bitstream *)block_local,&eb,pvStack_48);
    if (iVar1 != 0) {
      return 1;
    }
    if (eb == 0) break;
    if (eb == 0xfffff) {
      iVar1 = vs_u((bitstream *)block_local,&sign,6);
      if (iVar1 != 0) {
        return 1;
      }
      iVar1 = vs_u((bitstream *)block_local,(uint32_t *)&coeff,8);
      if (iVar1 != 0) {
        return 1;
      }
      if ((coeff == 0) || (coeff == 0x80)) {
        fprintf(_stderr,"Invalid escape code\n");
        return 1;
      }
      tab._0_4_ = coeff;
      if (0x80 < coeff) {
        tab._0_4_ = coeff | 0xffffff00;
      }
    }
    else {
      iVar1 = vs_u((bitstream *)block_local,(uint32_t *)((long)&tab + 4),1);
      if (iVar1 != 0) {
        return 1;
      }
      sign = eb >> 0xc;
      if (tab._4_4_ == 0) {
        tab._0_4_ = eb & 0xfff;
      }
      else {
        tab._0_4_ = -(eb & 0xfff);
      }
    }
    if (*block_local == 1) {
      if (0x3f < (int)tmp) {
        fprintf(_stderr,"block overflow\n");
        return 1;
      }
      while (uVar3 = sign - 1, sign != 0) {
        if (0x3f < (int)tmp) {
          sign = uVar3;
          fprintf(_stderr,"block overflow\n");
          return 1;
        }
        _i[(int)tmp] = 0;
        sign = uVar3;
        tmp = tmp + 1;
      }
      _i[(int)tmp] = (uint)tab;
      sign = uVar3;
      tmp = tmp + 1;
    }
  }
  if (*block_local == 1) {
    while ((int)tmp < 0x40) {
      _i[(int)tmp] = 0;
      tmp = tmp + 1;
    }
  }
  return 0;
}

Assistant:

int h261_block(struct bitstream *str, int32_t *block, int intra) {
	int i = 0;
	if (intra) {
		uint32_t val = block[0];
		if (str->dir == VS_ENCODE) {
			if (val >= 0xff || val == 0) {
				fprintf(stderr, "Invalid INTRA DC coeff\n");
				return 1;
			}
			if (val == 0x80)
				val = 0xff;
		}
		if (vs_u(str, &val, 8)) return 1;
		if (str->dir == VS_DECODE) {
			if (val == 0 || val == 0x80) {
				fprintf(stderr, "Invalid INTRA DC coeff\n");
				return 1;
			}
			if (val == 0xff)
				val = 0x80;
			block[0] = val;
		}
		i = 1;
	}
	while (1) {
		uint32_t tmp, run, eb, sign;
		int32_t coeff;
		const struct vs_vlc_val *tab;
		if (i == 0)
			tab = block_0_vlc;
		else
			tab = block_vlc;
		if (str->dir == VS_ENCODE) {
			run = 0;
			while (i < 64 && !block[i])
				i++, run++;
			if (i == 64) {
				tmp = 0;
			} else {
				coeff = block[i];
				if (abs(coeff) > 127) {
					fprintf(stderr, "Coeff too large\n");
					return 1;
				}
				tmp = abs(coeff) | run << 12;
				sign = coeff < 0;
				int j;
				for (j = 0; tab[j].blen; j++) {
					if (tab[j].val == tmp) {
						break;
					}
				}
				if (tab[j].val != tmp)
					tmp = 0xfffff;
				eb = coeff & 0xff;
				i++;
			}
		}
		if (vs_vlc(str, &tmp, tab)) return 1;
		if (tmp == 0) {
			/* end of block */
			if (str->dir == VS_DECODE) {
				while (i < 64)
					block[i++] = 0;
			}
			return 0;
		} else if (tmp == 0xfffff) {
			/* escape */
			if (vs_u(str, &run, 6)) return 1;
			if (vs_u(str, &eb, 8)) return 1;
			if (eb == 0 || eb == 0x80) {
				fprintf(stderr, "Invalid escape code\n");
				return 1;
			}
			coeff = eb;
			if (coeff > 0x80)
				coeff |= -0x100;
		} else {
			/* normal coefficient */
			if (vs_u(str, &sign, 1)) return 1;
			run = tmp >> 12;
			if (sign)
				coeff = -(tmp & 0xfff);
			else
				coeff = tmp & 0xfff;
		}
		if (str->dir == VS_DECODE) {
			if (i >= 64) {
				fprintf(stderr, "block overflow\n");
				return 1;
			}
			while (run--) {
				if (i >= 64) {
					fprintf(stderr, "block overflow\n");
					return 1;
				}
				block[i++] = 0;
			}
			block[i++] = coeff;
		}
	}
}